

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::LeaveScriptStart<false>(ThreadContext *this,void *frameAddress)

{
  code *pcVar1;
  bool bVar2;
  ImplicitCallFlags IVar3;
  DWORD DVar4;
  undefined4 *puVar5;
  ScriptEntryExitRecord *pSVar6;
  Recycler *this_00;
  ScriptEntryExitRecord *entryExitRecord;
  void *frameAddress_local;
  ThreadContext *this_local;
  
  bVar2 = IsScriptActive(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x6f8,"(this->IsScriptActive())","this->IsScriptActive()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,RunPhase);
  if (bVar2) {
    DVar4 = ::GetCurrentThreadId();
    Output::Trace(RunPhase,L"%p> LeaveScriptStart(%p): Level %d\n",(ulong)DVar4,this,
                  (ulong)this->callRootLevel);
    Output::Flush();
  }
  pSVar6 = GetScriptEntryExit(this);
  if ((pSVar6 == (ScriptEntryExitRecord *)0x0) ||
     (pSVar6->frameIdOfScriptExitFunction != (void *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0x705,
                       "(entryExitRecord && entryExitRecord->frameIdOfScriptExitFunction == nullptr)"
                       ,"Missing LeaveScriptEnd or EnterScriptStart");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar6->frameIdOfScriptExitFunction = frameAddress;
  this->isScriptActive = false;
  this_00 = GetRecycler(this);
  Memory::Recycler::SetIsScriptActive(this_00,false);
  IVar3 = GetImplicitCallFlags(this);
  pSVar6->savedImplicitCallFlags = IVar3;
  *(byte *)pSVar6 = *(byte *)pSVar6 & 0xfd;
  *(byte *)pSVar6 = *(byte *)pSVar6 & 0xf7;
  *(byte *)pSVar6 = *(byte *)pSVar6 & 0xef;
  return;
}

Assistant:

void
ThreadContext::LeaveScriptStart(void * frameAddress)
{
    Assert(this->IsScriptActive());

#if DBG_DUMP
    if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::RunPhase))
    {
        Output::Trace(Js::RunPhase, _u("%p> LeaveScriptStart(%p): Level %d\n"), ::GetCurrentThreadId(), this, this->callRootLevel);
        Output::Flush();
    }
#endif

    Js::ScriptEntryExitRecord * entryExitRecord = this->GetScriptEntryExit();

    AssertMsg(entryExitRecord && entryExitRecord->frameIdOfScriptExitFunction == nullptr,
              "Missing LeaveScriptEnd or EnterScriptStart");

    entryExitRecord->frameIdOfScriptExitFunction = frameAddress;

    this->isScriptActive = false;
    this->GetRecycler()->SetIsScriptActive(false);

    AssertMsg(!(leaveForHost && this->IsDisableImplicitCall()),
        "Disable implicit call should have been caught before leaving script for host");

    // Save the implicit call flags
    entryExitRecord->savedImplicitCallFlags = this->GetImplicitCallFlags();

    // clear the hasReentered to detect if we have reentered into script
    entryExitRecord->hasReentered = false;
#if DBG || defined(PROFILE_EXEC)
    entryExitRecord->leaveForHost = leaveForHost;
#endif
#if DBG
    entryExitRecord->leaveForAsyncHostOperation = false;
#endif

#ifdef PROFILE_EXEC
    if (leaveForHost)
    {
        entryExitRecord->scriptContext->ProfileEnd(Js::RunPhase);
    }
#endif
}